

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O0

unique_ptr<vigra::Decoder,_std::default_delete<vigra::Decoder>_> __thiscall
vigra::TIFFCodecFactory::getDecoder(TIFFCodecFactory *this)

{
  _Head_base<0UL,_vigra::Decoder_*,_false> in_RDI;
  _Head_base<0UL,_vigra::Decoder_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  TIFFSetWarningHandler(vigraWarningHandler);
  operator_new(0x30);
  TIFFDecoder::TIFFDecoder((TIFFDecoder *)this_00._M_head_impl);
  std::unique_ptr<vigra::Decoder,std::default_delete<vigra::Decoder>>::
  unique_ptr<std::default_delete<vigra::Decoder>,void>
            ((unique_ptr<vigra::Decoder,_std::default_delete<vigra::Decoder>_> *)
             this_00._M_head_impl,in_RDI._M_head_impl);
  return (__uniq_ptr_data<vigra::Decoder,_std::default_delete<vigra::Decoder>,_true,_true>)
         (tuple<vigra::Decoder_*,_std::default_delete<vigra::Decoder>_>)this_00._M_head_impl;
}

Assistant:

VIGRA_UNIQUE_PTR<Decoder> TIFFCodecFactory::getDecoder() const
    {
        // use 'NULL' to silence all warnings
        TIFFSetWarningHandler((TIFFErrorHandler)&vigraWarningHandler);

        return VIGRA_UNIQUE_PTR<Decoder>( new TIFFDecoder() );
    }